

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O2

bool __thiscall DTextEnterMenu::MenuEvent(DTextEnterMenu *this,int key,bool fromcontroller)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  DMenu *pDVar5;
  long lVar6;
  uint uVar7;
  
  if (key == 7) {
    pDVar5 = GC::ReadBarrier<DMenu>((DMenu **)&(this->super_DMenu).mParentMenu);
    (*(pDVar5->super_DObject)._vptr_DObject[8])(pDVar5,0xb,0);
    bVar2 = DMenu::MenuEvent(&this->super_DMenu,7,fromcontroller);
    return bVar2;
  }
  if (fromcontroller) {
    this->mInputGridOkay = true;
  }
  else if ((this->mInputGridOkay & 1U) == 0) {
    return false;
  }
  uVar3 = this->InputGridX;
  uVar7 = this->InputGridY;
  if (uVar7 == 0xffffffff || uVar3 == 0xffffffff) {
    this->InputGridX = 0;
    this->InputGridY = 0;
    uVar7 = 0;
    uVar3 = 0;
  }
  bVar2 = false;
  switch(key) {
  case 0:
    iVar4 = uVar7 + 4;
    break;
  case 1:
    iVar4 = uVar7 + 1;
    break;
  case 2:
    iVar4 = uVar3 + 0xc;
    goto LAB_003359ce;
  case 3:
    iVar4 = uVar3 + 1;
LAB_003359ce:
    this->InputGridX = iVar4 % 0xd;
    goto LAB_003359d7;
  default:
    goto switchD_00335931_caseD_4;
  case 6:
    if ((0xc < uVar3) || (4 < uVar7)) {
      __assert_fail("unsigned(InputGridX) < INPUTGRID_WIDTH && unsigned(InputGridY) < INPUTGRID_HEIGHT"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/menu/menuinput.cpp"
                    ,0xff,"virtual bool DTextEnterMenu::MenuEvent(int, bool)");
    }
    lVar6 = (ulong)uVar3 + (ulong)uVar7 * 0xd;
    if ((char)lVar6 != '?') {
      if (((uint)lVar6 & 0xff) != 0x40) {
        uVar3 = this->mEnterPos;
        if (this->mEnterSize <= uVar3) {
          return true;
        }
        cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789+-=.,!?@\'\":;[]()<>^#$%&*/_ \b"[lVar6];
        if (this->mSizeMode != 2) {
          iVar4 = FFont::StringWidth(SmallFont,(BYTE *)this->mEnterString);
          if ((ulong)(this->mEnterSize * 8 - 8) <= (ulong)(long)iVar4) {
            return true;
          }
          uVar3 = this->mEnterPos;
        }
        this->mEnterString[uVar3] = cVar1;
        uVar3 = this->mEnterPos + 1;
        this->mEnterPos = uVar3;
        this->mEnterString[uVar3] = '\0';
        return true;
      }
      if (*this->mEnterString == '\0') {
        return true;
      }
      pDVar5 = GC::ReadBarrier<DMenu>((DMenu **)&(this->super_DMenu).mParentMenu);
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
      (*(pDVar5->super_DObject)._vptr_DObject[8])(pDVar5,10,0);
      return true;
    }
  case 8:
    bVar2 = true;
    if (this->mEnterPos != 0) {
      uVar3 = this->mEnterPos - 1;
      this->mEnterPos = uVar3;
      this->mEnterString[uVar3] = '\0';
    }
    goto switchD_00335931_caseD_4;
  }
  this->InputGridY = iVar4 % 5;
LAB_003359d7:
  bVar2 = true;
switchD_00335931_caseD_4:
  return bVar2;
}

Assistant:

bool DTextEnterMenu::MenuEvent (int key, bool fromcontroller)
{
	if (key == MKEY_Back)
	{
		mParentMenu->MenuEvent(MKEY_Abort, false);
		return Super::MenuEvent(key, fromcontroller);
	}
	if (fromcontroller)
	{
		mInputGridOkay = true;
	}

	if (mInputGridOkay)
	{
		int ch;

		if (InputGridX == -1 || InputGridY == -1)
		{
			InputGridX = InputGridY = 0;
		}
		switch (key)
		{
		case MKEY_Down:
			InputGridY = (InputGridY + 1) % INPUTGRID_HEIGHT;
			return true;

		case MKEY_Up:
			InputGridY = (InputGridY + INPUTGRID_HEIGHT - 1) % INPUTGRID_HEIGHT;
			return true;

		case MKEY_Right:
			InputGridX = (InputGridX + 1) % INPUTGRID_WIDTH;
			return true;

		case MKEY_Left:
			InputGridX = (InputGridX + INPUTGRID_WIDTH - 1) % INPUTGRID_WIDTH;
			return true;

		case MKEY_Clear:
			if (mEnterPos > 0)
			{
				mEnterString[--mEnterPos] = 0;
			}
			return true;

		case MKEY_Enter:
			assert(unsigned(InputGridX) < INPUTGRID_WIDTH && unsigned(InputGridY) < INPUTGRID_HEIGHT);
			if (mInputGridOkay)
			{
				ch = InputGridChars[InputGridX + InputGridY * INPUTGRID_WIDTH];
				if (ch == 0)			// end
				{
					if (mEnterString[0] != '\0')
					{
						DMenu *parent = mParentMenu;
						Close();
						parent->MenuEvent(MKEY_Input, false);
						return true;
					}
				}
				else if (ch == '\b')	// bs
				{
					if (mEnterPos > 0)
					{
						mEnterString[--mEnterPos] = 0;
					}
				}
				else if (mEnterPos < mEnterSize &&
					(mSizeMode == 2/*entering player name*/ || (size_t)SmallFont->StringWidth(mEnterString) < (mEnterSize-1)*8))
				{
					mEnterString[mEnterPos] = ch;
					mEnterString[++mEnterPos] = 0;
				}
			}
			return true;

		default:
			break;	// Keep GCC quiet
		}
	}
	return false;
}